

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::sharecomptype<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool bVar1;
  Ok local_d2;
  allocator<char> local_d1;
  string local_d0;
  Err local_b0;
  uint local_8c;
  Err local_88;
  Err *local_58;
  Err *err;
  Result<wasm::Ok> _val;
  ParseDeclsCtx *ctx_local;
  
  join_0x00000010_0x00000000_ = sv("shared",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,join_0x00000010_0x00000000_);
  if (bVar1) {
    ParseDeclsCtx::setShared(ctx);
    describingcomptype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)&err,ctx);
    local_58 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
    bVar1 = local_58 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_88,local_58);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
    }
    local_8c = (uint)bVar1;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
    if (local_8c == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d2);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"expected end of shared comptype",&local_d1);
        Lexer::err(&local_b0,&ctx->in,&local_d0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
        wasm::Err::~Err(&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
      }
    }
  }
  else {
    describingcomptype<wasm::WATParser::ParseDeclsCtx>(__return_storage_ptr__,ctx);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> sharecomptype(Ctx& ctx) {
  if (ctx.in.takeSExprStart("shared"sv)) {
    ctx.setShared();
    CHECK_ERR(describingcomptype(ctx));
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of shared comptype");
    }
    return Ok{};
  }
  return describingcomptype(ctx);
}